

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Vector getNormalVector(Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector VVar12;
  
  uVar1 = (triangle->y).x;
  uVar3 = (triangle->y).y;
  fVar11 = (triangle->x).x;
  fVar7 = (triangle->x).y;
  fVar9 = (float)uVar1 - fVar11;
  fVar5 = (float)uVar3 - fVar7;
  fVar10 = (triangle->x).z;
  fVar8 = (triangle->y).z - fVar10;
  uVar2 = (triangle->z).x;
  uVar4 = (triangle->z).y;
  fVar11 = (float)uVar2 - fVar11;
  fVar7 = (float)uVar4 - fVar7;
  fVar10 = (triangle->z).z - fVar10;
  fVar6 = fVar5 * fVar10 - fVar8 * fVar7;
  fVar10 = fVar8 * fVar11 - fVar10 * fVar9;
  fVar11 = fVar7 * fVar9 - fVar11 * fVar5;
  fVar7 = SQRT(fVar11 * fVar11 + fVar6 * fVar6 + fVar10 * fVar10);
  VVar12.x = fVar6 / fVar7;
  VVar12.y = fVar10 / fVar7;
  VVar12.z = fVar11 / fVar7;
  return VVar12;
}

Assistant:

Vector getNormalVector(Triangle const& triangle)
{
  Vector v0v1 = triangle.y - triangle.x;
  Vector v0v2 = triangle.z - triangle.x;
  return normalize(crossProduct(v0v1, v0v2));
}